

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseComment
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int lenght;
  string<char> local_20;
  
  this->CurrentNodeType = EXN_COMMENT;
  pcVar1 = this->P;
  this->P = pcVar1 + 1;
  iVar4 = 1;
  lenght = -5;
  pcVar2 = pcVar1 + 2;
  do {
    pcVar3 = pcVar2;
    if (pcVar3[-1] == '<') {
      iVar4 = iVar4 + 1;
    }
    else if (pcVar3[-1] == '>') {
      iVar4 = iVar4 + -1;
    }
    this->P = pcVar3;
    lenght = lenght + 1;
    pcVar2 = pcVar3 + 1;
  } while (iVar4 != 0);
  this->P = pcVar3 + -3;
  core::string<char>::string<char>(&local_20,pcVar1 + 3,lenght);
  core::string<char>::operator=(&this->NodeName,&local_20);
  if (local_20.array != (char *)0x0) {
    operator_delete__(local_20.array);
  }
  this->P = this->P + 3;
  return;
}

Assistant:

void parseComment()
	{
		CurrentNodeType = EXN_COMMENT;
		P += 1;

		char_type *pCommentBegin = P;

		int count = 1;

		// move until end of comment reached
		while(count)
		{
			if (*P == L'>')
				--count;
			else
			if (*P == L'<')
				++count;

			++P;
		}

		P -= 3;
		NodeName = core::string<char_type>(pCommentBegin+2, (int)(P - pCommentBegin-2));
		P += 3;
	}